

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bplustree.cpp
# Opt level: O2

void __thiscall BPlusTree::PrintNode(BPlusTree *this,shared_ptr<Node> *node)

{
  element_type *peVar1;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  ostream *poVar3;
  long lVar4;
  int i;
  ulong uVar5;
  
  std::operator<<((ostream *)&std::cout,"[");
  lVar4 = 0;
  for (uVar5 = 0; peVar1 = (node->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
      uVar5 < (ulong)((long)(peVar1->keys).super__Vector_base<float,_std::allocator<float>_>._M_impl
                            .super__Vector_impl_data._M_finish -
                      (long)(peVar1->keys).super__Vector_base<float,_std::allocator<float>_>._M_impl
                            .super__Vector_impl_data._M_start >> 2); uVar5 = uVar5 + 1) {
    pbVar2 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                             (__shared_ptr<void,_(__gnu_cxx::_Lock_policy)2> *)
                             ((long)(peVar1->ptrs).
                                    super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar4));
    poVar3 = std::operator<<((ostream *)pbVar2,"|");
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,(((node->super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                                )->keys).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start[uVar5]);
    std::operator<<(poVar3,"|");
    lVar4 = lVar4 + 0x10;
  }
  pbVar2 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                           &(peVar1->ptrs).
                            super__Vector_base<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish[-1].
                            super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>);
  poVar3 = std::operator<<((ostream *)pbVar2,"]");
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

void BPlusTree::PrintNode(std::shared_ptr<Node> node) {
    std::cout << "[";
    for (int i = 0; i < node->keys.size(); i++) {
        std::cout << node->ptrs[i] << "|" << node->keys[i]<< "|";
    }
    std::cout << node->ptrs[node->ptrs.size()-1] << "]" << std::endl;
}